

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  uint uVar1;
  int iVar2;
  int *in_RCX;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  secp256k1_context *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  code *in_stack_00000008;
  undefined8 in_stack_00000010;
  int zero;
  int is_nonce_valid;
  uint count;
  uchar nonce32 [32];
  int is_sec_valid;
  int ret;
  secp256k1_scalar msg;
  secp256k1_scalar non;
  secp256k1_scalar sec;
  int *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int flag;
  secp256k1_scalar *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  uint local_94 [25];
  undefined8 local_30;
  undefined8 local_28;
  int *local_20;
  secp256k1_context *local_8;
  
  local_94[0] = 0;
  flag = 0;
  *in_RSI = 0;
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  *in_RDX = 0;
  in_RDX[1] = 0;
  in_RDX[2] = 0;
  in_RDX[3] = 0;
  if (in_RCX != (int *)0x0) {
    *in_RCX = 0;
  }
  if (in_stack_00000008 == (code *)0x0) {
    in_stack_00000008 = nonce_function_rfc6979;
  }
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  uVar1 = secp256k1_scalar_set_b32_seckey
                    (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28);
  secp256k1_scalar_cmov(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,flag);
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)CONCAT44(flag,in_stack_ffffffffffffff40),
             (uchar *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (int *)in_stack_ffffffffffffff30);
  while( true ) {
    iVar2 = (*in_stack_00000008)
                      (&stack0xffffffffffffff48,local_28,local_30,0,in_stack_00000010,flag);
    local_94[0] = (uint)(iVar2 != 0);
    if (local_94[0] == 0) break;
    iVar2 = secp256k1_scalar_set_b32_seckey
                      (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28);
    secp256k1_declassify(local_8,&stack0xffffffffffffff40,4);
    if (iVar2 != 0) {
      in_stack_ffffffffffffff28 = local_20;
      local_94[0] = secp256k1_ecdsa_sig_sign
                              ((secp256k1_ecmult_gen_context *)non.d[3],(secp256k1_scalar *)non.d[2]
                               ,(secp256k1_scalar *)non.d[1],(secp256k1_scalar *)non.d[0],
                               (secp256k1_scalar *)msg.d[3],(secp256k1_scalar *)msg.d[2],
                               (int *)sec.d[1]);
      secp256k1_declassify(local_8,local_94,4);
      if (local_94[0] != 0) goto LAB_0162fa71;
    }
    flag = flag + 1;
  }
  local_94[0] = 0;
LAB_0162fa71:
  local_94[0] = uVar1 & local_94[0];
  secp256k1_memclear(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  secp256k1_scalar_clear((secp256k1_scalar *)0x162fa96);
  secp256k1_scalar_clear((secp256k1_scalar *)0x162faa0);
  secp256k1_scalar_clear((secp256k1_scalar *)0x162faad);
  secp256k1_scalar_cmov(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,flag);
  secp256k1_scalar_cmov(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,flag);
  if (local_20 != (int *)0x0) {
    secp256k1_int_cmov(local_20,(int *)&stack0xffffffffffffff3c,
                       (uint)((local_94[0] != 0 ^ 0xffU) & 1));
  }
  return local_94[0];
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}